

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O3

void __thiscall QToolButton::mousePressEvent(QToolButton *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  QStyleOptionToolButton opt;
  undefined8 local_d8;
  undefined1 local_d0 [16];
  QStyleOptionToolButton local_c0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  memset(&local_c0,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&local_c0);
  (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))(this,&local_c0);
  auVar8._8_8_ = local_d0._8_8_;
  auVar8._0_8_ = local_d0._0_8_;
  if ((*(int *)(e + 0x40) == 1) && (local_d0 = auVar8, *(int *)(lVar1 + 0x2e8) == 1)) {
    pQVar5 = QWidget::style((QWidget *)this);
    local_d0 = (**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,4,&local_c0,2,this);
    if ((local_d0._0_4_ <= local_d0._8_4_) && (local_d0._4_4_ <= local_d0._12_4_)) {
      auVar8 = QEventPoint::position();
      dVar7 = (double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._0_8_
      ;
      bVar2 = 2147483647.0 < dVar7;
      if (dVar7 <= -2147483648.0) {
        dVar7 = -2147483648.0;
      }
      dVar6 = (double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._8_8_
      ;
      bVar3 = 2147483647.0 < dVar6;
      if (dVar6 <= -2147483648.0) {
        dVar6 = -2147483648.0;
      }
      local_d8 = CONCAT44((int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                       ~-(ulong)bVar3 & (ulong)dVar6),
                          (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                       ~-(ulong)bVar2 & (ulong)dVar7));
      cVar4 = QRect::contains((QPoint *)local_d0,SUB81(&local_d8,0));
      if (cVar4 != '\0') {
        *(byte *)(lVar1 + 0x2ec) = (*(byte *)(lVar1 + 0x2ec) & 0xfc) + 1;
        showMenu(this);
        goto LAB_004bb3cf;
      }
    }
  }
  *(byte *)(lVar1 + 0x2ec) = *(byte *)(lVar1 + 0x2ec) & 0xfc | 2;
  QAbstractButton::mousePressEvent(&this->super_QAbstractButton,e);
LAB_004bb3cf:
  QFont::~QFont(&local_c0.font);
  if (&(local_c0.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c0.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_c0.icon);
  QStyleOption::~QStyleOption((QStyleOption *)&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButton::mousePressEvent(QMouseEvent *e)
{
    Q_D(QToolButton);
#if QT_CONFIG(menu)
    QStyleOptionToolButton opt;
    initStyleOption(&opt);
    if (e->button() == Qt::LeftButton && (d->popupMode == MenuButtonPopup)) {
        QRect popupr = style()->subControlRect(QStyle::CC_ToolButton, &opt,
                                               QStyle::SC_ToolButtonMenu, this);
        if (popupr.isValid() && popupr.contains(e->position().toPoint())) {
            d->buttonPressed = QToolButtonPrivate::MenuButtonPressed;
            showMenu();
            return;
        }
    }
#endif
    d->buttonPressed = QToolButtonPrivate::ToolButtonPressed;
    QAbstractButton::mousePressEvent(e);
}